

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.hpp
# Opt level: O1

void __thiscall
BSP<int>::runAndWait
          (BSP<int> *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *input,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *output,bool setAffinity)

{
  pointer pvVar1;
  WorkerThread *pWVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  runtime_error *this_00;
  ulong uVar10;
  size_type *psVar11;
  WorkerThread *this_01;
  uint uVar12;
  uint __len;
  string __str;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> lockableVectors;
  UTimer timer;
  ulong local_d8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  string local_a0;
  vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_> local_80;
  UTimer local_68;
  
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::vector
            (&local_80,
             ((long)(output->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(output->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_68);
  setupWorkers(this,setAffinity);
  swapVectors(this,output,&local_80);
  if (this->EOC_FLAG != 0) {
    local_d8 = 0;
    do {
      uVar12 = (uint)local_d8;
      if ((int)((ulong)((long)(this->supersteps).
                              super__Vector_base<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->supersteps).
                             super__Vector_base<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) <= (int)uVar12) break;
      uVar8 = -uVar12;
      if (0 < (int)uVar12) {
        uVar8 = uVar12;
      }
      __len = 1;
      if (9 < uVar8) {
        uVar10 = (ulong)uVar8;
        uVar6 = 4;
        do {
          __len = uVar6;
          uVar7 = (uint)uVar10;
          if (uVar7 < 100) {
            __len = __len - 2;
            goto LAB_001067f5;
          }
          if (uVar7 < 1000) {
            __len = __len - 1;
            goto LAB_001067f5;
          }
          if (uVar7 < 10000) goto LAB_001067f5;
          uVar10 = uVar10 / 10000;
          uVar6 = __len + 4;
        } while (99999 < uVar7);
        __len = __len + 1;
      }
LAB_001067f5:
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct
                ((ulong)local_c0,(char)__len - ((char)(local_d8 >> 0x18) >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_c0[0] + (uVar12 >> 0x1f),__len,uVar8);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)local_c0,0,(char *)0x0,0x10b3fa);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_a0.field_2._M_allocated_capacity = *psVar11;
        local_a0.field_2._8_8_ = plVar9[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar11;
        local_a0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_a0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      UTimer::UTimer(&local_68,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (local_c0[0] != local_b0) {
        operator_delete(local_c0[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n\nRunning superstep  ",0x15);
      plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar12);
      std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
      std::ostream::put((char)plVar9);
      std::ostream::flush();
      uVar8 = Superstep<int>::runStep
                        ((this->supersteps).
                         super__Vector_base<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_d8].
                         super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &this->workers,input,&local_80);
      if (uVar8 == this->NEXT_STEP_FLAG) {
        local_d8 = (ulong)(uVar12 + 1);
      }
      else if ((uVar8 != this->EOC_FLAG) && (local_d8 = (ulong)uVar8, (int)uVar8 < 0)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"Wrong number of superstep returned by \'atExit\' function");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      swapVectors(this,input,&local_80);
      UTimer::~UTimer(&local_68);
    } while (uVar8 != this->EOC_FLAG);
  }
  pvVar1 = (output->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar3 = (input->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar4 = (output->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (output->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (output->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (input->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (output->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pvVar3;
  (output->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (input->
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (input->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = pvVar4;
  (input->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pvVar5;
  (input->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar1;
  pWVar2 = (this->workers).super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (this->workers).super__Vector_base<WorkerThread,_std::allocator<WorkerThread>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_01 != pWVar2; this_01 = this_01 + 1)
  {
    WorkerThread::stopWorker(this_01);
  }
  std::vector<LockableVector<int>,_std::allocator<LockableVector<int>_>_>::~vector(&local_80);
  return;
}

Assistant:

void BSP<T>::runAndWait (std::vector<std::vector<T>> &input, std::vector<std::vector<T>> &output, bool setAffinity) {
	int retVal		= 0;
	int nextStep	= 0;
	std::vector<LockableVector<T>> lockableVectors (output.size());

	setupWorkers (setAffinity);

	swapVectors (output, lockableVectors);
	

	while (retVal != EOC_FLAG && nextStep < (int) supersteps.size()) {

		{
			UTimer timer ("Superstep " + std::to_string (nextStep));
			std::cout << "\n\nRunning superstep  " << nextStep << std::endl;

			retVal	= supersteps[nextStep]->runStep (workers, input, lockableVectors);

			// Swapping vectors
			if (retVal == NEXT_STEP_FLAG) {
				nextStep++;
			}
			else if (retVal == EOC_FLAG) {
				// Do nothing
			}
			else if (retVal>=0) {
				nextStep	= retVal;
			}
			else
				throw std::runtime_error ("Wrong number of superstep returned by 'atExit' function");

			swapVectors (input, lockableVectors);
		}
	}

	
	std::swap (output, input);

	std::for_each (workers.begin(), workers.end(), [] (WorkerThread &w) {
		w.stopWorker ();
	});
}